

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyMesh::OutputSimpleMesh
          (ChLoadBodyMesh *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_pos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_vel,
          vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *triangles)

{
  pointer pCVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  ChVector<double> local_48;
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (vert_pos,((long)(this->contactmesh).m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->contactmesh).m_vertices.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (vert_vel,((long)(this->contactmesh).m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->contactmesh).m_vertices.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (triangles,&(this->contactmesh).m_face_v_indices);
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    pCVar1 = (this->contactmesh).m_vertices.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->contactmesh).m_vertices.
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x18) <= uVar3)
    break;
    ChFrame<double>::TransformPointLocalToParent
              (&local_48,
               (ChFrame<double> *)
               &((this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_ChBodyFrame,(ChVector<double> *)((long)pCVar1->m_data + lVar2));
    pCVar1 = (vert_pos->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ChVector<double> *)((long)pCVar1->m_data + lVar2) != &local_48) {
      *(double *)((long)pCVar1->m_data + lVar2) = local_48.m_data[0];
      *(double *)((long)pCVar1->m_data + lVar2 + 8) = local_48.m_data[1];
      *(double *)((long)pCVar1->m_data + lVar2 + 0x10) = local_48.m_data[2];
    }
    ChFrameMoving<double>::PointSpeedLocalToParent
              (&local_48,
               &(((this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_ChBodyFrame).super_ChFrameMoving<double>,
               (ChVector<double> *)
               ((long)((this->contactmesh).m_vertices.
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar2));
    pCVar1 = (vert_vel->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ChVector<double> *)((long)pCVar1->m_data + lVar2) != &local_48) {
      *(double *)((long)pCVar1->m_data + lVar2) = local_48.m_data[0];
      *(double *)((long)pCVar1->m_data + lVar2 + 8) = local_48.m_data[1];
      *(double *)((long)pCVar1->m_data + lVar2 + 0x10) = local_48.m_data[2];
    }
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x18;
  }
  return;
}

Assistant:

void ChLoadBodyMesh::OutputSimpleMesh(
    std::vector<ChVector<>>& vert_pos,     // array of vertexes (absolute xyz positions)
    std::vector<ChVector<>>& vert_vel,     // array of vertexes (absolute xyz velocities, might be useful)
    std::vector<ChVector<int>>& triangles  // array of triangles (indexes to vertexes, ccw)
) {
    vert_pos.resize(contactmesh.m_vertices.size());
    vert_vel.resize(contactmesh.m_vertices.size());
    triangles = contactmesh.m_face_v_indices;
    // Transform the body-relative collision mesh into the output vectors with positions and speeds in absolute coords
    for (size_t i = 0; i < contactmesh.m_vertices.size(); ++i) {
        vert_pos[i] = contactbody->TransformPointLocalToParent(contactmesh.m_vertices[i]);
        vert_vel[i] = contactbody->PointSpeedLocalToParent(contactmesh.m_vertices[i]);
    }
}